

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall CVmRun::compute_diff_dec(CVmRun *this,uchar *p)

{
  int iVar1;
  uchar *in_RSI;
  vm_val_t val;
  vm_val_t val2;
  int in_stack_00000050;
  vm_val_t *in_stack_ffffffffffffffc8;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffd0;
  CVmRun *in_stack_ffffffffffffffd8;
  uchar *local_8;
  
  vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffffd8,1);
  CVmStack::get(0);
  iVar1 = compute_diff(in_stack_ffffffffffffffd8,(vm_val_t *)in_stack_ffffffffffffffd0.native_desc,
                       in_stack_ffffffffffffffc8);
  local_8 = in_RSI;
  if (iVar1 == 0) {
    CVmStack::pop((vm_val_t *)&stack0xffffffffffffffc8);
    CVmStack::push((vm_val_t *)&stack0xffffffffffffffd8);
    local_8 = op_overload(this,p._4_4_,(int)p,(vm_val_t *)val2.val.native_desc,val2._6_2_,val2.typ,
                          in_stack_00000050);
  }
  return local_8;
}

Assistant:

const uchar *CVmRun::compute_diff_dec(VMG_ const uchar *p)
{
    /* compute TOS - 1, leaving the result in TOS */
    vm_val_t val2;
    val2.set_int(1);
    if (compute_diff(vmg_ get(0), &val2))
    {
        return p;
    }
    else
    {
        /* no native implementation - check for an overload */
        vm_val_t val;
        pop(&val);
        push(&val2);
        return op_overload(vmg_ p - entry_ptr_native_, -1,
                           &val, G_predef->operator_sub, 1,
                           VMERR_BAD_TYPE_SUB);
    }
}